

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_sock_packet_rotate_unsafe(uintptr_t fd)

{
  short *psVar1;
  long lVar2;
  fio_packet_s *packet;
  fio_data_s *pfVar3;
  long lVar4;
  
  pfVar3 = fio_data;
  lVar4 = fd * 0xa8;
  packet = *(fio_packet_s **)((long)fio_data + lVar4 + 0x40);
  *(fio_packet_s **)((long)fio_data + lVar4 + 0x40) = packet->next;
  LOCK();
  psVar1 = (short *)((long)pfVar3 + lVar4 + 0x68);
  *psVar1 = *psVar1 + -1;
  pfVar3 = fio_data;
  UNLOCK();
  lVar2 = (long)fio_data + lVar4 + 0x40;
  if (packet->next == (fio_packet_s *)0x0) {
    *(long *)(lVar2 + 8) = lVar2;
    *(undefined2 *)((long)pfVar3 + lVar4 + 0x68) = 0;
    fio_packet_free(packet);
    return;
  }
  if (packet == *(fio_packet_s **)(lVar2 + 8)) {
    *(long *)(lVar2 + 8) = lVar2;
    fio_packet_free(packet);
    return;
  }
  (*packet->dealloc)((packet->data).buffer);
  fio_free(packet);
  return;
}

Assistant:

static inline void fio_sock_packet_rotate_unsafe(uintptr_t fd) {
  fio_packet_s *packet = fd_data(fd).packet;
  fd_data(fd).packet = packet->next;
  fio_atomic_sub(&fd_data(fd).packet_count, 1);
  if (!packet->next) {
    fd_data(fd).packet_last = &fd_data(fd).packet;
    fd_data(fd).packet_count = 0;
  } else if (&packet->next == fd_data(fd).packet_last) {
    fd_data(fd).packet_last = &fd_data(fd).packet;
  }
  fio_packet_free(packet);
}